

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

bool soul::isSafeIdentifierName(string *s)

{
  __type_conflict1 _Var1;
  string local_50;
  string local_30;
  string *local_10;
  string *s_local;
  
  local_10 = s;
  std::__cxx11::string::string((string *)&local_50,(string *)s);
  makeSafeIdentifierName(&local_30,&local_50);
  _Var1 = std::operator==(s,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return _Var1;
}

Assistant:

bool isSafeIdentifierName (std::string s)
{
    return s == makeSafeIdentifierName (s);
}